

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcp.hpp
# Opt level: O1

void lcp_from_sa<unsigned_long>
               (string *S,vector<unsigned_long,_std::allocator<unsigned_long>_> *SA,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *ISA,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *LCP)

{
  long lVar1;
  size_type __new_size;
  pointer puVar2;
  pointer puVar3;
  unsigned_long uVar4;
  pointer pcVar5;
  unsigned_long uVar6;
  long lVar7;
  ulong uVar8;
  unsigned_long uVar9;
  unsigned_long uVar10;
  size_type sVar11;
  unsigned_long uVar12;
  
  lVar7 = (long)(SA->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(SA->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start;
  __new_size = S->_M_string_length;
  if (__new_size != lVar7 >> 3) {
    __assert_fail("S.size() == SA.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/lcp.hpp"
                  ,0x2f,
                  "void lcp_from_sa(const std::string &, const std::vector<index_t> &, const std::vector<index_t> &, std::vector<index_t> &) [index_t = unsigned long]"
                 );
  }
  if (lVar7 != (long)(ISA->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(ISA->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start) {
    __assert_fail("SA.size() == ISA.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/include/lcp.hpp"
                  ,0x30,
                  "void lcp_from_sa(const std::string &, const std::vector<index_t> &, const std::vector<index_t> &, std::vector<index_t> &) [index_t = unsigned long]"
                 );
  }
  if ((long)(LCP->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(LCP->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 != __new_size) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(LCP,__new_size);
  }
  puVar2 = (LCP->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  *puVar2 = 0;
  sVar11 = S->_M_string_length;
  if (sVar11 != 0) {
    puVar3 = (ISA->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    uVar8 = 0;
    uVar9 = 0;
    do {
      uVar10 = 0;
      if (uVar9 != 0) {
        uVar10 = uVar9 - 1;
      }
      uVar9 = uVar10;
      if (uVar10 + uVar8 < sVar11) {
        uVar4 = puVar3[uVar8];
        pcVar5 = (S->_M_dataplus)._M_p;
        uVar12 = uVar10;
        do {
          uVar9 = uVar10;
          if (((uVar4 == 0) ||
              (uVar6 = (SA->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start[uVar4 - 1], uVar9 = uVar12,
              sVar11 <= uVar12 + uVar6)) || (pcVar5[uVar12 + uVar8] != pcVar5[uVar12 + uVar6]))
          break;
          lVar1 = uVar8 + uVar12;
          uVar12 = uVar12 + 1;
          uVar9 = sVar11 + lVar7;
        } while (lVar1 + 1U < sVar11);
      }
      puVar2[puVar3[uVar8]] = uVar9;
      uVar8 = uVar8 + 1;
      sVar11 = S->_M_string_length;
      lVar7 = lVar7 + -1;
    } while (uVar8 < sVar11);
  }
  return;
}

Assistant:

void lcp_from_sa(const std::string& S, const std::vector<index_t>& SA, const std::vector<index_t>& ISA, std::vector<index_t>& LCP) {
    // TODO: cite the source for this linear O(n) algorithm!

    // input sizes must be equal
    assert(S.size() == SA.size());
    assert(SA.size() == ISA.size());

    // init LCP array if not yet of correct size
    if (LCP.size() != S.size()) {
        LCP.resize(S.size());
    }

    // first LCP is undefined -> set to 0:
    LCP[0] = 0;

    std::size_t h = 0;

    // in string order!
    for (std::size_t i = 0; i < S.size(); ++i) {
        // length of currently equal characters (in string order, next LCP value
        // is always >= current lcp - 1)
        std::size_t k = 0;
        if (h > 0)
            k = h-1;
        // comparing suffix starting from i=SA[ISA[i]] with the previous
        // suffix in SA order: SA[ISA[i]-1]
        while (i+k < S.size() && ISA[i] > 0 && SA[ISA[i]-1]+k < S.size() && S[i+k] == S[SA[ISA[i]-1]+k])
            k++;
        LCP[ISA[i]] = k;
        h = k;
    }
}